

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupTopAnd_iter(Gia_Man_t *p,int fVerbose)

{
  char cVar1;
  int iVar2;
  int v;
  int iVar3;
  int iVar4;
  uint uVar5;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Gia_Obj_t *pObj_00;
  int *pCi2Lit_00;
  void *__s;
  bool bVar6;
  char *pVar2Val;
  int *pCi2Lit;
  int nCiLits;
  int iObjId;
  int iLit;
  int i;
  Vec_Int_t *vLeaves;
  Vec_Int_t *vFront;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  int fVerbose_local;
  Gia_Man_t *p_local;
  
  p_00 = Vec_IntAlloc(1000);
  p_01 = Vec_IntAlloc(1000);
  iObjId = 0;
  while( true ) {
    iVar2 = Vec_IntSize(p->vCos);
    bVar6 = false;
    if (iObjId < iVar2) {
      vFront = (Vec_Int_t *)Gia_ManCo(p,iObjId);
      bVar6 = vFront != (Vec_Int_t *)0x0;
    }
    if (!bVar6) break;
    pObj_00 = Gia_ObjFanin0((Gia_Obj_t *)vFront);
    iVar2 = Gia_ObjIsConst0(pObj_00);
    if (iVar2 == 0) {
      iVar2 = Gia_ObjFaninC0((Gia_Obj_t *)vFront);
      if (iVar2 == 0) {
        iVar2 = Gia_ObjFaninId0p(p,(Gia_Obj_t *)vFront);
        Vec_IntPush(p_00,iVar2);
      }
      else {
        iVar2 = Gia_ObjFaninLit0p(p,(Gia_Obj_t *)vFront);
        Vec_IntPush(p_01,iVar2);
      }
    }
    iObjId = iObjId + 1;
  }
  iVar2 = Vec_IntSize(p_00);
  if (iVar2 == 0) {
    if (fVerbose != 0) {
      printf("The AIG cannot be decomposed using AND-decomposition.\n");
    }
    Vec_IntFree(p_00);
    Vec_IntFree(p_01);
    p_local = Gia_ManDupNormalize(p,0);
  }
  else {
    iObjId = 0;
    while( true ) {
      iVar2 = Vec_IntSize(p_00);
      bVar6 = false;
      if (iObjId < iVar2) {
        iVar2 = Vec_IntEntry(p_00,iObjId);
        vFront = (Vec_Int_t *)Gia_ManObj(p,iVar2);
        bVar6 = vFront != (Vec_Int_t *)0x0;
      }
      if (!bVar6) break;
      iVar2 = Gia_ObjIsCi((Gia_Obj_t *)vFront);
      if (iVar2 == 0) {
        iVar2 = Gia_ObjIsAnd((Gia_Obj_t *)vFront);
        if (iVar2 == 0) {
          __assert_fail("Gia_ObjIsAnd(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                        ,0xa18,"Gia_Man_t *Gia_ManDupTopAnd_iter(Gia_Man_t *, int)");
        }
        iVar2 = Gia_ObjFaninC0((Gia_Obj_t *)vFront);
        if (iVar2 == 0) {
          iVar2 = Gia_ObjFaninId0p(p,(Gia_Obj_t *)vFront);
          Vec_IntPush(p_00,iVar2);
        }
        else {
          iVar2 = Gia_ObjFaninLit0p(p,(Gia_Obj_t *)vFront);
          Vec_IntPush(p_01,iVar2);
        }
        iVar2 = Gia_ObjFaninC1((Gia_Obj_t *)vFront);
        if (iVar2 == 0) {
          iVar2 = Gia_ObjFaninId1p(p,(Gia_Obj_t *)vFront);
          Vec_IntPush(p_00,iVar2);
        }
        else {
          iVar2 = Gia_ObjFaninLit1p(p,(Gia_Obj_t *)vFront);
          Vec_IntPush(p_01,iVar2);
        }
      }
      else {
        iVar2 = Gia_ObjId(p,(Gia_Obj_t *)vFront);
        iVar2 = Abc_Var2Lit(iVar2,0);
        Vec_IntPush(p_01,iVar2);
      }
      iObjId = iObjId + 1;
    }
    Vec_IntFree(p_00);
    pCi2Lit._0_4_ = 0;
    iVar2 = Gia_ManObjNum(p);
    pCi2Lit_00 = (int *)malloc((long)iVar2 << 2);
    iVar2 = Gia_ManObjNum(p);
    memset(pCi2Lit_00,0xff,(long)iVar2 << 2);
    iVar2 = Gia_ManObjNum(p);
    __s = malloc((long)iVar2);
    iVar2 = Gia_ManObjNum(p);
    memset(__s,0xff,(long)iVar2);
    for (iObjId = 0; iVar2 = Vec_IntSize(p_01), iObjId < iVar2; iObjId = iObjId + 1) {
      iVar2 = Vec_IntEntry(p_01,iObjId);
      v = Abc_Lit2Var(iVar2);
      vFront = (Vec_Int_t *)Gia_ManObj(p,v);
      iVar3 = Gia_ObjIsCi((Gia_Obj_t *)vFront);
      if (iVar3 != 0) {
        iVar3 = Abc_LitIsCompl(iVar2);
        iVar4 = Gia_ObjCioId((Gia_Obj_t *)vFront);
        pCi2Lit_00[iVar4] = (uint)((iVar3 != 0 ^ 0xffU) & 1);
        pCi2Lit._0_4_ = (uint)pCi2Lit + 1;
      }
      if ((*(char *)((long)__s + (long)v) == '\0') || (*(char *)((long)__s + (long)v) == '\x01')) {
        cVar1 = *(char *)((long)__s + (long)v);
        iVar2 = Abc_LitIsCompl(iVar2);
        if (cVar1 != iVar2) break;
      }
      else {
        iVar2 = Abc_LitIsCompl(iVar2);
        *(char *)((long)__s + (long)v) = (char)iVar2;
      }
    }
    iVar2 = Vec_IntSize(p_01);
    if (iObjId < iVar2) {
      printf("Problem is trivially UNSAT.\n");
      if (pCi2Lit_00 != (int *)0x0) {
        free(pCi2Lit_00);
      }
      if (__s != (void *)0x0) {
        free(__s);
      }
      Vec_IntFree(p_01);
      p_local = Gia_ManDupNormalize(p,0);
    }
    else {
      Vec_IntClear(p_01);
      iObjId = 0;
      while( true ) {
        bVar6 = false;
        if (iObjId < p->nObjs) {
          vFront = (Vec_Int_t *)Gia_ManObj(p,iObjId);
          bVar6 = vFront != (Vec_Int_t *)0x0;
        }
        if (!bVar6) break;
        iVar2 = Gia_ObjIsCi((Gia_Obj_t *)vFront);
        if ((iVar2 == 0) &&
           ((*(char *)((long)__s + (long)iObjId) == '\0' ||
            (*(char *)((long)__s + (long)iObjId) == '\x01')))) {
          iVar2 = Abc_Var2Lit(iObjId,(int)*(char *)((long)__s + (long)iObjId));
          Vec_IntPush(p_01,iVar2);
        }
        iObjId = iObjId + 1;
      }
      if (fVerbose != 0) {
        uVar5 = Vec_IntSize(p_01);
        printf("Detected %6d AND leaves and %6d CI leaves.\n",(ulong)uVar5,(ulong)(uint)pCi2Lit);
      }
      if ((uint)pCi2Lit == 0) {
        pObj = (Gia_Obj_t *)Gia_ManDupDfsLitArray(p,p_01);
      }
      else {
        pObj = (Gia_Obj_t *)Gia_ManDupDfsCiMap(p,pCi2Lit_00,p_01);
      }
      if (pCi2Lit_00 != (int *)0x0) {
        free(pCi2Lit_00);
      }
      if (__s != (void *)0x0) {
        free(__s);
      }
      Vec_IntFree(p_01);
      p_local = (Gia_Man_t *)pObj;
    }
  }
  return p_local;
}

Assistant:

Gia_Man_t * Gia_ManDupTopAnd_iter( Gia_Man_t * p, int fVerbose )  
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    Vec_Int_t * vFront, * vLeaves;
    int i, iLit, iObjId, nCiLits, * pCi2Lit;
    char * pVar2Val;
    // collect the frontier
    vFront = Vec_IntAlloc( 1000 );
    vLeaves = Vec_IntAlloc( 1000 );
    Gia_ManForEachCo( p, pObj, i )
    {
        if ( Gia_ObjIsConst0( Gia_ObjFanin0(pObj) ) )
            continue;
        if ( Gia_ObjFaninC0(pObj) )
            Vec_IntPush( vLeaves, Gia_ObjFaninLit0p(p, pObj) );
        else
            Vec_IntPush( vFront, Gia_ObjFaninId0p(p, pObj) );
    }
    if ( Vec_IntSize(vFront) == 0 )
    {
        if ( fVerbose )
            printf( "The AIG cannot be decomposed using AND-decomposition.\n" );
        Vec_IntFree( vFront );
        Vec_IntFree( vLeaves );
        return Gia_ManDupNormalize( p, 0 );
    }
    // expand the frontier
    Gia_ManForEachObjVec( vFront, p, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
        {
            Vec_IntPush( vLeaves, Abc_Var2Lit( Gia_ObjId(p, pObj), 0 ) );
            continue;
        }
        assert( Gia_ObjIsAnd(pObj) );
        if ( Gia_ObjFaninC0(pObj) )
            Vec_IntPush( vLeaves, Gia_ObjFaninLit0p(p, pObj) );
        else
            Vec_IntPush( vFront, Gia_ObjFaninId0p(p, pObj) );
        if ( Gia_ObjFaninC1(pObj) )
            Vec_IntPush( vLeaves, Gia_ObjFaninLit1p(p, pObj) );
        else
            Vec_IntPush( vFront, Gia_ObjFaninId1p(p, pObj) );
    }
    Vec_IntFree( vFront );
    // sort the literals
    nCiLits = 0;
    pCi2Lit = ABC_FALLOC( int, Gia_ManObjNum(p) );
    pVar2Val = ABC_FALLOC( char, Gia_ManObjNum(p) );
    Vec_IntForEachEntry( vLeaves, iLit, i )
    {
        iObjId = Abc_Lit2Var(iLit);
        pObj = Gia_ManObj(p, iObjId);
        if ( Gia_ObjIsCi(pObj) )
        {
            pCi2Lit[Gia_ObjCioId(pObj)] = !Abc_LitIsCompl(iLit);
            nCiLits++;
        }
        if ( pVar2Val[iObjId] != 0 && pVar2Val[iObjId] != 1 )
            pVar2Val[iObjId] = Abc_LitIsCompl(iLit);
        else if ( pVar2Val[iObjId] != Abc_LitIsCompl(iLit) )
            break;
    }
    if ( i < Vec_IntSize(vLeaves) )
    {
        printf( "Problem is trivially UNSAT.\n" );
        ABC_FREE( pCi2Lit );
        ABC_FREE( pVar2Val );
        Vec_IntFree( vLeaves );
        return Gia_ManDupNormalize( p, 0 );
    }
    // create array of input literals
    Vec_IntClear( vLeaves );
    Gia_ManForEachObj( p, pObj, i )
        if ( !Gia_ObjIsCi(pObj) && (pVar2Val[i] == 0 || pVar2Val[i] == 1) )
            Vec_IntPush( vLeaves, Abc_Var2Lit(i, pVar2Val[i]) );
    if ( fVerbose )
        printf( "Detected %6d AND leaves and %6d CI leaves.\n", Vec_IntSize(vLeaves), nCiLits );
    // create the input map
    if ( nCiLits == 0 )
        pNew = Gia_ManDupDfsLitArray( p, vLeaves );
    else
        pNew = Gia_ManDupDfsCiMap( p, pCi2Lit, vLeaves );
    ABC_FREE( pCi2Lit );
    ABC_FREE( pVar2Val );
    Vec_IntFree( vLeaves );
    return pNew;
}